

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::eliminate_pooling1x1(NetOptimize *this)

{
  ulong uVar1;
  int iVar2;
  Layer *pLVar3;
  Layer *pLVar4;
  long lVar5;
  bool bVar6;
  ulong uVar7;
  int k;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  uVar9 = (ulong)((long)(this->super_Net).layers.
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->super_Net).layers.
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar10 = uVar9 & 0xffffffff;
  if ((int)uVar9 < 1) {
    uVar10 = 0;
  }
  uVar9 = 0;
  do {
    if (uVar9 == uVar10) {
      return 0;
    }
    bVar6 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar9]->type,"Pooling");
    if ((((((!bVar6) &&
           (pLVar3 = (this->super_Net).layers.
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9],
           *(int *)((long)&pLVar3[1].type._M_dataplus._M_p + 4) == 0)) &&
          ((int)pLVar3[1].type._M_string_length == 0)) &&
         ((*(int *)((long)&pLVar3[1].type._M_string_length + 4) == 0 &&
          (*(int *)&pLVar3[1].type.field_2 == 0)))) &&
        ((*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 1 &&
         ((iVar2._0_1_ = pLVar3[1].one_blob_only, iVar2._1_1_ = pLVar3[1].support_inplace,
          iVar2._2_1_ = pLVar3[1].support_vulkan, iVar2._3_1_ = pLVar3[1].support_packing,
          iVar2 == 1 && (pLVar3[1].typeindex == 1)))))) &&
       ((*(int *)&pLVar3[1].type._M_dataplus._M_p == 1 &&
        (*(int *)((long)&pLVar3[1].type.field_2 + 4) == 0)))) {
      iVar2 = *(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = uVar9;
      while (uVar7 = uVar1, 0 < (long)uVar7) {
        uVar1 = uVar7 - 1;
        bVar6 = std::operator==(&(this->super_Net).layers.
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar7 - 1]->type,
                                "ncnnfused");
        if (!bVar6) {
          pLVar4 = (this->super_Net).layers.
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7 - 1];
          lVar5 = *(long *)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
          lVar11 = 0;
          for (lVar8 = 0;
              (long)*(pointer *)
                     ((long)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                     8) - lVar5 >> 2 != lVar8; lVar8 = lVar8 + 1) {
            if (*(int *)(lVar5 + lVar8 * 4) == iVar2) {
              if (0 < (long)uVar7) {
                pLVar4 = (this->super_Net).layers.
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)uVar1];
                fprintf(_stderr,"eliminate_pooling1x1 %s %s\n",(pLVar4->name)._M_dataplus._M_p,
                        (pLVar3->name)._M_dataplus._M_p);
                iVar2 = *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                *(int *)(*(long *)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + (lVar11 >> 0x1e)) = iVar2;
                (this->super_Net).blobs.super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar2].producer = (int)uVar1;
                std::__cxx11::string::assign((char *)&pLVar3->type);
              }
              goto LAB_00113bbd;
            }
            lVar11 = lVar11 + 0x100000000;
          }
        }
      }
    }
LAB_00113bbd:
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_pooling1x1()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->pad_left != 0 || pooling->pad_right != 0 || pooling->pad_top != 0 || pooling->pad_bottom != 0)
            continue;

        if (pooling->kernel_w != 1 || pooling->kernel_h != 1 || pooling->stride_w != 1 || pooling->stride_h != 1)
            continue;

        if (pooling->global_pooling != 0)
            continue;

        // Any - Pooling
        int bottom_blob_index = layers[i]->bottoms[0];

        int top_i = -1;
        int j = i - 1;
        for (; j>=0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            for (int k=0; k<layers[j]->tops.size(); k++)
            {
                if (layers[j]->tops[k] == bottom_blob_index)
                {
                    top_i = k;
                    break;
                }
            }

            if (top_i != -1)
                break;
        }

        if (j == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_pooling1x1 %s %s\n", any->name.c_str(), pooling->name.c_str());

        int top_blob_index_final = pooling->tops[0];
        any->tops[top_i] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;
        pooling->type = "ncnnfused";
    }

    return 0;
}